

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O2

bool __thiscall Assimp::ASE::Parser::ParseString(Parser *this,string *out,char *szName)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  char szBuffer [1024];
  undefined1 *local_428 [2];
  undefined1 local_418 [1008];
  
  bVar1 = SkipSpaces<char>(&this->filePtr);
  if (bVar1) {
    if (*this->filePtr == '\"') {
      pcVar2 = this->filePtr + 1;
      this->filePtr = pcVar2;
      pcVar3 = pcVar2;
      while( true ) {
        if (*pcVar3 == '\"') {
          local_428[0] = local_418;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_428,pcVar2,pcVar3);
          std::__cxx11::string::operator=((string *)out,(string *)local_428);
          std::__cxx11::string::~string((string *)local_428);
          this->filePtr = pcVar3 + 1;
          return true;
        }
        if (*pcVar3 == '\0') break;
        pcVar3 = pcVar3 + 1;
      }
      pcVar3 = 
      "Unable to parse %s block: Strings are expected to be enclosed in double quotation marks but EOF was reached before a closing quotation mark was encountered"
      ;
    }
    else {
      pcVar3 = 
      "Unable to parse %s block: Strings are expected to be enclosed in double quotation marks";
    }
  }
  else {
    pcVar3 = "Unable to parse %s block: Unexpected EOL";
  }
  snprintf((char *)local_428,0x400,pcVar3,szName);
  LogWarning(this,(char *)local_428);
  return false;
}

Assistant:

bool Parser::ParseString(std::string& out,const char* szName)
{
    char szBuffer[1024];
    if (!SkipSpaces(&filePtr))
    {

        ai_snprintf(szBuffer, 1024, "Unable to parse %s block: Unexpected EOL",szName);
        LogWarning(szBuffer);
        return false;
    }
    // there must be '"'
    if ('\"' != *filePtr)
    {

        ai_snprintf(szBuffer, 1024, "Unable to parse %s block: Strings are expected "
            "to be enclosed in double quotation marks",szName);
        LogWarning(szBuffer);
        return false;
    }
    ++filePtr;
    const char* sz = filePtr;
    while (true)
    {
        if ('\"' == *sz)break;
        else if ('\0' == *sz)
        {
            ai_snprintf(szBuffer, 1024, "Unable to parse %s block: Strings are expected to "
                "be enclosed in double quotation marks but EOF was reached before "
                "a closing quotation mark was encountered",szName);
            LogWarning(szBuffer);
            return false;
        }
        sz++;
    }
    out = std::string(filePtr,(uintptr_t)sz-(uintptr_t)filePtr);
    filePtr = sz+1;
    return true;
}